

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

sopno dupl(parse *p,sopno start,sopno finish)

{
  sopno sVar1;
  long lVar2;
  
  lVar2 = finish - start;
  if (finish < start) {
    __assert_fail("finish >= start",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x5ba,"sopno dupl()");
  }
  sVar1 = p->slen;
  if (lVar2 != 0) {
    enlarge(p,p->ssize + lVar2);
    if (p->ssize < p->slen + lVar2) {
      __assert_fail("p->ssize >= p->slen + len",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x5be,"sopno dupl()");
    }
    memcpy(p->strip + p->slen,p->strip + start,lVar2 * 8);
    p->slen = p->slen + lVar2;
  }
  return sVar1;
}

Assistant:

static sopno			/* start of duplicate */
dupl(p, start, finish)
struct parse *p;
sopno start;			/* from here */
sopno finish;			/* to this less one */
{
	sopno ret = HERE();
	sopno len = finish - start;

	assert(finish >= start);
	if (len == 0)
		return(ret);
	enlarge(p, p->ssize + len);	/* this many unexpected additions */
	assert(p->ssize >= p->slen + len);
	(void) memcpy((char *)(p->strip + p->slen),
		(char *)(p->strip + start), (size_t)len*sizeof(sop));
	p->slen += len;
	return(ret);
}